

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O2

void OperExt(OpConfig *EA)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = EA->Mode;
  if (uVar1 < 0xd) {
    if ((0x540U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x880U >> (uVar1 & 0x1f) & 1) == 0) {
        if (uVar1 == 0xc) {
          if (Size == 1) {
            if (EA->Value - 0x100U < 0xfffffffffffffe80) goto LAB_00108e4f;
          }
          else if ((Size == 2) && (EA->Value - 0x10000U < 0xfffffffffffe8000)) {
LAB_00108e4f:
            Error(EA->Loc,9);
            return;
          }
        }
      }
      else {
        uVar2 = EA->Value;
        if ((long)(char)uVar2 != uVar2) {
          Error(EA->Loc,9);
          uVar2 = (ulong)(byte)EA->Value;
        }
        uVar2 = (long)(EA->Xn << 0xc) | uVar2 & 0xff;
        EA->Value = uVar2;
        if (EA->X == 2) {
          uVar2 = uVar2 | 0x8000;
          EA->Value = uVar2;
        }
        if (EA->Xsize == 4) {
          EA->Value = uVar2 | 0x800;
        }
      }
    }
    else if ((long)(short)EA->Value != EA->Value) goto LAB_00108e4f;
  }
  return;
}

Assistant:

void 
OperExt (register struct OpConfig *EA)
/* Calculate operand Extension word, and check range of operands. */
{
	switch (EA->Mode) {
	case AbsL:
		break; /* No range checking is needed. */
	case AbsW:
	case ARDisp:
	case PCDisp:
		if ((EA->Value < -32768) || (EA->Value > 32767))
			Error(EA->Loc, SizeErr);
		break;
	case ARDisX:
	case PCDisX:
		if ((EA->Value < -128) || (EA->Value > 127))
			Error(EA->Loc, SizeErr);
		EA->Value &= 0x00FF; /* Displacement */
		EA->Value |= EA->Xn << 12; /* Index reg. */
		if (EA->X == Areg)
			EA->Value |= 0x8000; /* Addr. Reg. */
		if (EA->Xsize == Long)
			EA->Value |= 0x0800; /* Long reg.  */
		break;
	case Imm:
		if (Size == Word) {
			if ((EA->Value < -32768) || (EA->Value > 65535L))
				Error(EA->Loc, SizeErr);
		} else if (Size == Byte)
			if ((EA->Value < -128) || (EA->Value > 255))
				Error(EA->Loc, SizeErr);
		break;
	}
}